

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

ArrayXZ * __thiscall IMLE::getMultiplePredictionsJacobian(IMLE *this)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  DenseStorage<double,__1,__1,__1,_0> *pDVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  pointer pMVar12;
  pointer pFVar13;
  undefined8 *puVar14;
  long lVar15;
  void *pvVar16;
  Index size;
  long lVar17;
  pointer pMVar18;
  Index col;
  long lVar19;
  Index row_2;
  ulong uVar20;
  long lVar21;
  Index index_1;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  XprTypeNested pMVar26;
  long lVar27;
  long lVar28;
  Index inner;
  Index inner_1;
  long lVar29;
  ulong uVar30;
  ActualDstType actualDst_3;
  pointer pMVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  Mat weightedKappa;
  add local_199;
  long local_198;
  false_type local_189;
  XprTypeNested local_188;
  IMLE *local_180;
  long local_178;
  double *local_170;
  ArrayXZ *local_168;
  Mat *local_160;
  Mat *local_158;
  long local_150;
  pointer local_148;
  void *local_140;
  ulong local_138;
  Mat *local_128;
  undefined1 local_120 [16];
  PointerType local_110;
  Mat *local_108;
  variable_if_dynamic<long,__1> local_100;
  variable_if_dynamic<long,__1> local_f8;
  XprTypeNested local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  variable_if_dynamic<long,__1> local_c0;
  variable_if_dynamic<long,__1> local_b8;
  variable_if_dynamic<long,__1> local_b0;
  long local_a8;
  Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> local_a0;
  DenseStorage<double,__1,__1,__1,_0> local_60;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  if (this->hasPredJacobian == false) {
    pMVar18 = (this->predictionsJacobian).
              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar12 = (this->predictionsJacobian).
              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pMVar31 = pMVar18;
    if (pMVar12 != pMVar18) {
      do {
        free((pMVar31->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data);
        pMVar31 = pMVar31 + 1;
      } while (pMVar31 != pMVar12);
      (this->predictionsJacobian).
      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar18;
    }
    local_168 = &this->predictionsJacobian;
    pMVar18 = (this->predictionsVarJacobian).
              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar12 = (this->predictionsVarJacobian).
              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pMVar31 = pMVar18;
    if (pMVar12 != pMVar18) {
      do {
        free((pMVar31->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data);
        pMVar31 = pMVar31 + 1;
      } while (pMVar31 != pMVar12);
      (this->predictionsVarJacobian).
      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar18;
    }
    iVar11 = this->nSolFound;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)&this->zeroXZ);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::resize(local_168,(long)iVar11,(value_type *)&local_48);
    free(local_48.m_data);
    iVar11 = this->nSolFound;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_60,(DenseStorage<double,__1,__1,__1,_0> *)&this->zeroXZ);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::resize(&this->predictionsVarJacobian,(long)iVar11,(value_type *)&local_60);
    free(local_60.m_data);
    lVar22 = (long)this->d;
    lVar15 = (long)this->M;
    if ((lVar15 != 0 && lVar22 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar15),0) < lVar22)) {
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = operator_delete;
      __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_158 = &this->zeta;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)local_158,lVar15 * lVar22,lVar22,lVar15);
    local_120._0_8_ = SEXT48(this->d);
    local_120._8_8_ = SEXT48(this->nSolFound);
    local_110 = (PointerType)0x0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_140,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)local_120);
    local_180 = this;
    if (0 < this->M) {
      lVar15 = 0;
      do {
        pvVar16 = (void *)((long)(this->sNearest).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar15] * local_138 * 8 +
                          (long)local_140);
        uVar20 = local_138;
        if ((((ulong)pvVar16 & 7) == 0) &&
           (uVar20 = (ulong)((uint)((ulong)pvVar16 >> 3) & 1), (long)local_138 <= (long)uVar20)) {
          uVar20 = local_138;
        }
        pFVar13 = (this->experts).
                  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  .
                  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        dVar8 = pFVar13[lVar15].super_LinearExpert.p_z_T;
        lVar22 = *(long *)&pFVar13[lVar15].super_LinearExpert.kappa.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
        if (0 < (long)uVar20) {
          uVar23 = 0;
          do {
            *(double *)((long)pvVar16 + uVar23 * 8) =
                 *(double *)(lVar22 + uVar23 * 8) * dVar8 + *(double *)((long)pvVar16 + uVar23 * 8);
            uVar23 = uVar23 + 1;
          } while (uVar20 != uVar23);
        }
        lVar24 = local_138 - uVar20;
        uVar23 = (lVar24 - (lVar24 >> 0x3f) & 0xfffffffffffffffeU) + uVar20;
        if (1 < lVar24) {
          do {
            pdVar1 = (double *)(lVar22 + uVar20 * 8);
            dVar9 = pdVar1[1];
            pdVar2 = (double *)((long)pvVar16 + uVar20 * 8);
            dVar10 = pdVar2[1];
            pdVar3 = (double *)((long)pvVar16 + uVar20 * 8);
            *pdVar3 = *pdVar1 * dVar8 + *pdVar2;
            pdVar3[1] = dVar9 * dVar8 + dVar10;
            uVar20 = uVar20 + 2;
          } while ((long)uVar20 < (long)uVar23);
        }
        if ((long)uVar23 < (long)local_138) {
          do {
            *(double *)((long)pvVar16 + uVar23 * 8) =
                 *(double *)(lVar22 + uVar23 * 8) * dVar8 + *(double *)((long)pvVar16 + uVar23 * 8);
            uVar23 = uVar23 + 1;
          } while (local_138 != uVar23);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < this->M);
      if (0 < this->M) {
        local_160 = &this->fInvRj;
        local_128 = &this->invRxj;
        local_198 = 0;
        pMVar26 = (XprTypeNested)0x0;
        do {
          pdVar1 = (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data;
          uVar20 = (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
          uVar23 = uVar20;
          if ((((ulong)(pdVar1 + uVar20 * (long)pMVar26) & 7) == 0) &&
             (uVar23 = (ulong)((uint)((ulong)(pdVar1 + uVar20 * (long)pMVar26) >> 3) & 1),
             (long)uVar20 <= (long)uVar23)) {
            uVar23 = uVar20;
          }
          pFVar13 = (this->experts).
                    super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                    .
                    super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          dVar8 = pFVar13[(long)pMVar26].super_LinearExpert.p_z_T;
          lVar24 = (long)(this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(long)pMVar26];
          dVar10 = (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[lVar24];
          lVar24 = lVar24 * local_138;
          dVar9 = (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data[(long)pMVar26];
          lVar15 = *(long *)&pFVar13[(long)pMVar26].super_LinearExpert.dGamma.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
          lVar22 = *(long *)&pFVar13[(long)pMVar26].super_LinearExpert.kappa.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
          if (0 < (long)uVar23) {
            uVar30 = 0;
            do {
              *(double *)((long)pdVar1 + uVar30 * 8 + uVar20 * local_198) =
                   ((*(double *)(lVar22 + uVar30 * 8) * dVar10 +
                    *(double *)(lVar15 + uVar30 * 8) * dVar8) -
                   *(double *)((long)local_140 + uVar30 * 8 + lVar24 * 8)) / dVar9;
              uVar30 = uVar30 + 1;
            } while (uVar23 != uVar30);
          }
          lVar28 = uVar20 - uVar23;
          lVar4 = (lVar28 - (lVar28 >> 0x3f) & 0xfffffffffffffffeU) + uVar23;
          if (1 < lVar28) {
            uVar30 = uVar23;
            do {
              pdVar2 = (double *)(lVar15 + uVar30 * 8);
              pdVar3 = (double *)(lVar22 + uVar30 * 8);
              pdVar5 = (double *)((long)local_140 + uVar30 * 8 + lVar24 * 8);
              auVar32._0_8_ = (*pdVar3 * dVar10 + *pdVar2 * dVar8) - *pdVar5;
              auVar32._8_8_ = (pdVar3[1] * dVar10 + pdVar2[1] * dVar8) - pdVar5[1];
              auVar33._8_8_ = dVar9;
              auVar33._0_8_ = dVar9;
              auVar33 = divpd(auVar32,auVar33);
              *(undefined1 (*) [16])((long)pdVar1 + uVar30 * 8 + uVar20 * local_198) = auVar33;
              uVar30 = uVar30 + 2;
            } while ((long)uVar30 < lVar4);
          }
          if (lVar4 < (long)uVar20) {
            lVar4 = (lVar28 / 2) * 0x10 + uVar23 * 8;
            lVar17 = 0;
            do {
              *(double *)((long)pdVar1 + lVar17 * 8 + uVar20 * local_198 + lVar4) =
                   ((*(double *)(lVar22 + lVar4 + lVar17 * 8) * dVar10 +
                    *(double *)(lVar15 + lVar4 + lVar17 * 8) * dVar8) -
                   *(double *)((long)local_140 + lVar17 * 8 + lVar4 + lVar24 * 8)) / dVar9;
              lVar17 = lVar17 + 1;
            } while (lVar28 % 2 != lVar17);
          }
          pFVar13 = (local_180->experts).
                    super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                    .
                    super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar1 = (local_180->fInvRj).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
          ;
          local_110 = (PointerType)
                      (local_180->fInvRj).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_rows;
          local_170 = pdVar1 + (long)local_110 * (long)pMVar26;
          local_d8._8_8_ =
               (local_180->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
          local_d8._0_8_ =
               (local_180->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data + local_d8._8_8_ * (long)pMVar26;
          local_e8._8_8_ = &pFVar13[(long)pMVar26].super_LinearExpert.Lambda;
          local_a0.m_matrix.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_rows.m_value =
               (local_180->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
          local_a0.m_matrix.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_data = (local_180->zeta).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
                   + local_a0.m_matrix.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                     .m_rows.m_value * (long)pMVar26;
          local_100.m_value = (long)local_160;
          local_f8.m_value = 0;
          local_c0.m_value = (long)local_128;
          local_b8.m_value = 0;
          local_a0.m_matrix.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
               local_158;
          local_a0.m_matrix.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          m_startRow.m_value = 0;
          local_148 = (local_180->predictionsJacobian).
                      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          lVar22 = (long)(local_180->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_start[(long)pMVar26];
          local_150 = lVar22 * 3;
          lVar15 = local_148[lVar22].
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
          ;
          if (0 < lVar15) {
            lVar24 = *(long *)&pFVar13[(long)pMVar26].super_LinearExpert.Lambda.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
            local_178 = *(Index *)((long)&pFVar13[(long)pMVar26].super_LinearExpert.Lambda + 8);
            lVar4 = (long)local_148[lVar22].
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_data;
            lVar28 = local_148[lVar22].
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
            lVar17 = 0;
            lVar19 = 0;
            lVar25 = lVar24;
            lVar27 = lVar4;
            do {
              if (0 < lVar17) {
                *(double *)(lVar4 + lVar19 * lVar28 * 8) =
                     *local_170 * *(double *)(lVar24 + lVar19 * local_178 * 8) +
                     *(double *)(lVar4 + lVar19 * lVar28 * 8);
              }
              uVar20 = lVar28 - lVar17 & 0xfffffffffffffffe;
              lVar29 = uVar20 + lVar17;
              lVar21 = lVar17;
              if (0 < (long)uVar20) {
                do {
                  pdVar2 = (double *)(lVar25 + lVar21 * 8);
                  dVar10 = pdVar2[1];
                  pdVar3 = (double *)((long)pdVar1 + lVar21 * 8 + (long)local_110 * local_198);
                  dVar9 = pdVar3[1];
                  pdVar5 = (double *)(lVar27 + lVar21 * 8);
                  dVar8 = pdVar5[1];
                  pdVar6 = (double *)(lVar27 + lVar21 * 8);
                  *pdVar6 = *pdVar3 * *pdVar2 + *pdVar5;
                  pdVar6[1] = dVar9 * dVar10 + dVar8;
                  lVar21 = lVar21 + 2;
                } while (lVar21 < lVar29);
              }
              for (; lVar29 < lVar28; lVar29 = lVar29 + 1) {
                *(double *)(lVar27 + lVar29 * 8) =
                     *(double *)((long)pdVar1 + lVar29 * 8 + (long)local_110 * local_198) *
                     *(double *)(lVar25 + lVar29 * 8) + *(double *)(lVar27 + lVar29 * 8);
              }
              lVar17 = (long)(lVar17 + (ulong)((uint)lVar28 & 1)) % 2;
              if (lVar28 < lVar17) {
                lVar17 = lVar28;
              }
              lVar19 = lVar19 + 1;
              lVar25 = lVar25 + local_178 * 8;
              lVar27 = lVar27 + lVar28 * 8;
            } while (lVar19 != lVar15);
          }
          local_188 = pMVar26;
          local_120._8_8_ = local_170;
          local_f0 = pMVar26;
          local_e8._0_8_ = local_110;
          local_b0.m_value = (long)pMVar26;
          local_a8 = local_d8._8_8_;
          local_a0.m_matrix.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          m_startCol.m_value = (long)pMVar26;
          local_a0.m_matrix.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          m_outerStride =
               local_a0.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
               .m_rows.m_value;
          Eigen::internal::
          outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>,Eigen::internal::generic_product_impl<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
                    (local_148 + lVar22,
                     (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_d8,
                     &local_a0,(sub *)&local_199,&local_189);
          this = local_180;
          pMVar26 = local_188;
          local_120._8_8_ =
               (local_180->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
          local_120._0_8_ =
               (local_180->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data + local_120._8_8_ * (long)local_188;
          local_e8._8_8_ =
               (local_180->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
          local_e8._0_8_ =
               (local_180->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data + local_e8._8_8_ * (long)local_188;
          local_108 = local_160;
          local_100.m_value = 0;
          local_f8.m_value = (long)local_188;
          local_d8._8_8_ = local_158;
          local_d8._16_8_ = 0;
          local_c0.m_value = (long)local_188;
          local_f0 = (XprTypeNested)local_120._8_8_;
          local_b8.m_value = local_e8._8_8_;
          Eigen::internal::
          outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>,Eigen::internal::generic_product_impl<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>,Eigen::DenseShape,Eigen::DenseShape,5>::add>
                    ((local_180->predictionsVarJacobian).
                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     (local_180->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)local_188],
                     (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_120,
                     (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                      *)local_e8,&local_199,&local_189);
          pMVar26 = (XprTypeNested)
                    ((long)&(pMVar26->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                            m_storage.m_data + 1);
          local_198 = local_198 + 8;
        } while ((long)pMVar26 < (long)this->M);
      }
    }
    if (0 < this->nSolFound) {
      lVar15 = 0;
      do {
        dVar8 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[lVar15];
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          pMVar26 = (XprTypeNested)(lVar15 * 0x10);
          pMVar18 = (this->predictionsJacobian).
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar22 = pMVar18[lVar15].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
          if (0 < lVar22) {
            pMVar12 = (this->predictionsVarJacobian).
                      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar1 = *(double **)
                      ((long)&(pMVar26->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_data +
                      (long)(this->predictions).
                            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
            lVar24 = (long)pMVar12[lVar15].
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data;
            local_170 = (double *)
                        pMVar12[lVar15].
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_rows;
            lVar4 = (long)pMVar18[lVar15].
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_data;
            lVar28 = pMVar18[lVar15].
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
            lVar25 = 0;
            lVar19 = 0;
            lVar17 = lVar24;
            lVar27 = lVar4;
            do {
              if (0 < lVar25) {
                *(double *)(lVar4 + lVar19 * lVar28 * 8) =
                     *pdVar1 * *(double *)(lVar24 + lVar19 * (long)local_170 * 8) +
                     *(double *)(lVar4 + lVar19 * lVar28 * 8);
              }
              uVar20 = lVar28 - lVar25 & 0xfffffffffffffffe;
              lVar29 = uVar20 + lVar25;
              lVar21 = lVar25;
              if (0 < (long)uVar20) {
                do {
                  pdVar2 = (double *)(lVar17 + lVar21 * 8);
                  dVar10 = pdVar2[1];
                  dVar9 = (pdVar1 + lVar21)[1];
                  pdVar3 = (double *)(lVar27 + lVar21 * 8);
                  dVar8 = pdVar3[1];
                  pdVar5 = (double *)(lVar27 + lVar21 * 8);
                  *pdVar5 = pdVar1[lVar21] * *pdVar2 + *pdVar3;
                  pdVar5[1] = dVar9 * dVar10 + dVar8;
                  lVar21 = lVar21 + 2;
                } while (lVar21 < lVar29);
              }
              for (; lVar29 < lVar28; lVar29 = lVar29 + 1) {
                *(double *)(lVar27 + lVar29 * 8) =
                     pdVar1[lVar29] * *(double *)(lVar17 + lVar29 * 8) +
                     *(double *)(lVar27 + lVar29 * 8);
              }
              lVar25 = (long)(lVar25 + (ulong)((uint)lVar28 & 1)) % 2;
              if (lVar28 < lVar25) {
                lVar25 = lVar28;
              }
              lVar19 = lVar19 + 1;
              lVar17 = lVar17 + (long)local_170 * 8;
              lVar27 = lVar27 + lVar28 * 8;
            } while (lVar19 != lVar22);
            pMVar18 = (local_168->
                      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            this = local_180;
            local_198 = lVar15 * 3;
            local_188 = pMVar26;
            local_178 = lVar15;
          }
          local_120._0_8_ =
               (long)&(pMVar26->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data +
               (long)(this->predictionsVar).
                     super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          local_120._8_8_ = pMVar18 + lVar15;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::DiagonalWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,1>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_120._8_8_,
                     (Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
                      *)local_120,(assign_op<double,_double> *)&local_199);
          local_120._8_8_ =
               (long)&(pMVar26->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data +
               (long)(this->predictionsVar).
                     super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          local_108 = (this->predictionsVarJacobian).
                      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar15;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::DiagonalWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,1>,Eigen::internal::assign_op<double,double>>
                    (local_108,
                     (Product<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
                      *)local_120,(assign_op<double,_double> *)&local_199);
        }
        else {
          pMVar18 = (this->predictionsJacobian).
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar1 = (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data;
          pDVar7 = (DenseStorage<double,__1,__1,__1,_0> *)(pMVar18 + lVar15);
          lVar22 = (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
          lVar24 = (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
          if ((pDVar7->m_rows != lVar22) ||
             (pMVar18[lVar15].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols != lVar24)) {
            if ((lVar24 != 0 && lVar22 != 0) &&
               (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar24),0) <
                lVar22)) goto LAB_0014e5e0;
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(pDVar7,lVar24 * lVar22,lVar22,lVar24)
            ;
            lVar22 = pDVar7->m_rows;
            lVar24 = pDVar7->m_cols;
          }
          lVar24 = lVar24 * lVar22;
          pdVar2 = pDVar7->m_data;
          uVar20 = lVar24 - (lVar24 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < lVar24) {
            lVar22 = 0;
            do {
              pdVar3 = pdVar1 + lVar22;
              dVar8 = pdVar3[1];
              pdVar5 = pdVar2 + lVar22;
              *pdVar5 = *pdVar3;
              pdVar5[1] = dVar8;
              lVar22 = lVar22 + 2;
            } while (lVar22 < (long)uVar20);
          }
          if ((long)uVar20 < lVar24) {
            do {
              pdVar2[uVar20] = pdVar1[uVar20];
              uVar20 = uVar20 + 1;
            } while (lVar24 - uVar20 != 0);
          }
          pMVar18 = (this->predictionsVarJacobian).
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar1 = (this->infinityXZ).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
          ;
          pDVar7 = (DenseStorage<double,__1,__1,__1,_0> *)(pMVar18 + lVar15);
          lVar22 = (this->infinityXZ).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
          ;
          lVar24 = (this->infinityXZ).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
          ;
          if ((pDVar7->m_rows != lVar22) ||
             (pMVar18[lVar15].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols != lVar24)) {
            if ((lVar24 != 0 && lVar22 != 0) &&
               (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar24),0) <
                lVar22)) {
LAB_0014e5e0:
              puVar14 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar14 = operator_delete;
              __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(pDVar7,lVar24 * lVar22,lVar22,lVar24)
            ;
            lVar22 = pDVar7->m_rows;
            lVar24 = pDVar7->m_cols;
          }
          lVar24 = lVar24 * lVar22;
          pdVar2 = pDVar7->m_data;
          uVar20 = lVar24 - (lVar24 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < lVar24) {
            lVar22 = 0;
            do {
              pdVar3 = pdVar1 + lVar22;
              dVar8 = pdVar3[1];
              pdVar5 = pdVar2 + lVar22;
              *pdVar5 = *pdVar3;
              pdVar5[1] = dVar8;
              lVar22 = lVar22 + 2;
            } while (lVar22 < (long)uVar20);
          }
          if ((long)uVar20 < lVar24) {
            do {
              pdVar2[uVar20] = pdVar1[uVar20];
              uVar20 = uVar20 + 1;
            } while (lVar24 - uVar20 != 0);
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < this->nSolFound);
    }
    this->hasPredJacobian = true;
    free(local_140);
  }
  return &this->predictionsJacobian;
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::ArrayXZ const &IMLE_base::getMultiplePredictionsJacobian()
{
    if( !hasPredJacobian )
    {
        predictionsJacobian.clear();
        predictionsVarJacobian.clear();
        predictionsJacobian.resize(nSolFound, zeroXZ);
        predictionsVarJacobian.resize(nSolFound, zeroXZ);
        zeta.resize(d,M);

        Mat weightedKappa = Mat::Zero(d,nSolFound);
        for( int j = 0; j < M; j++ )
            weightedKappa.col(sNearest[j]) += experts[j].get_p_z() * experts[j].getKappa();

        for( int j = 0; j < M; j++ )
        {
            zeta.col(j) = (experts[j].get_p_z() * experts[j].get_dGamma() + sumW(sNearest[j]) * experts[j].getKappa() - weightedKappa.col(sNearest[j])) / varPhiAuxj(j);

            predictionsJacobian[sNearest[j]].noalias() += fInvRj.col(j).asDiagonal() * experts[j].Lambda - invRxj.col(j) * zeta.col(j).transpose();
            predictionsVarJacobian[sNearest[j]].noalias() += fInvRj.col(j) * zeta.col(j).transpose();
        }

        for( int k = 0; k < nSolFound; k++ )
            if(sum_p_z(k) == 0.0)  // Not likely, but...
            {
                predictionsJacobian[k] = zeroXZ;
                predictionsVarJacobian[k] = infinityXZ;
            }
            else
            {
                predictionsJacobian[k].noalias() += predictions[k].asDiagonal() * predictionsVarJacobian[k];
                predictionsJacobian[k] = predictionsVar[k].asDiagonal() * predictionsJacobian[k];
                predictionsVarJacobian[k] = predictionsVar[k].cwiseAbs2().asDiagonal() * predictionsVarJacobian[k];
            }

        hasPredJacobian = true;
    }

    return predictionsJacobian;
}